

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O0

bool __thiscall DiskInterface::MakeDirs(DiskInterface *this,string *path)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  bool success;
  TimeStamp mtime;
  string err;
  undefined1 local_40 [8];
  string dir;
  string *path_local;
  DiskInterface *this_local;
  
  dir.field_2._8_8_ = path;
  anon_unknown.dwarf_61a08::DirName((string *)local_40,path);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)&mtime);
    lVar4 = (**(code **)(*(long *)this + 0x18))(this,local_40,(string *)&mtime);
    if (lVar4 < 0) {
      uVar5 = std::__cxx11::string::c_str();
      Error("%s",uVar5);
      this_local._7_1_ = false;
    }
    else if (lVar4 < 1) {
      bVar1 = MakeDirs(this,(string *)local_40);
      if (bVar1) {
        bVar2 = (**(code **)(*(long *)this + 0x20))(this,local_40);
        this_local._7_1_ = (bool)(bVar2 & 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
    err.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&mtime);
  }
  else {
    this_local._7_1_ = true;
    err.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool DiskInterface::MakeDirs(const string& path) {
  string dir = DirName(path);
  if (dir.empty())
    return true;  // Reached root; assume it's there.
  string err;
  TimeStamp mtime = Stat(dir, &err);
  if (mtime < 0) {
    Error("%s", err.c_str());
    return false;
  }
  if (mtime > 0)
    return true;  // Exists already; we're done.

  // Directory doesn't exist.  Try creating its parent first.
  bool success = MakeDirs(dir);
  if (!success)
    return false;
  return MakeDir(dir);
}